

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

bool __thiscall Js::DynamicObject::TryCopy(DynamicObject *this,DynamicObject *from)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  int iVar4;
  ScriptContext *this_00;
  DynamicType *pDVar5;
  DynamicTypeHandler *pDVar6;
  Type *dst;
  Type *src;
  undefined4 *puVar7;
  ArrayObject *pAVar8;
  Type *fromInlineSlots;
  Type *thisInlineSlots;
  int auxSlotCapacity;
  uint16 inlineSlotCapacity;
  int slotCapacity;
  DynamicObject *from_local;
  DynamicObject *this_local;
  
  this_00 = RecyclableObject::GetScriptContext(&from->super_RecyclableObject);
  bVar2 = ScriptContext::ShouldPerformRecordOrReplayAction(this_00);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ObjectCopyPhase);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = IsCompatibleForCopy(this,from);
      if (bVar2) {
        pDVar5 = GetDynamicType(from);
        bVar2 = DynamicType::ShareType(pDVar5);
        if (bVar2) {
          pDVar5 = GetDynamicType(from);
          ReplaceType(this,pDVar5);
          InitSlots(this,this);
          pDVar6 = GetTypeHandler(this);
          iVar4 = DynamicTypeHandler::GetSlotCapacity(pDVar6);
          pDVar6 = GetTypeHandler(this);
          uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar6);
          iVar4 = iVar4 - (uint)uVar3;
          if (0 < iVar4) {
            Memory::
            CopyArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                      (&this->auxSlots,(long)iVar4,&from->auxSlots,(long)iVar4);
          }
          if (uVar3 != 0) {
            dst = GetInlineSlots(this);
            src = GetInlineSlots(from);
            Memory::
            CopyArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                      (dst,(ulong)uVar3,src,(ulong)uVar3);
          }
          bVar2 = HasObjectArray(from);
          if (bVar2) {
            bVar2 = HasObjectArray(this);
            if (bVar2) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                          ,0x3ca,"(!this->HasObjectArray())",
                                          "!this->HasObjectArray()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            bVar2 = IsObjectHeaderInlinedTypeHandler(this);
            if (bVar2) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                          ,0x3cb,"(!this->IsObjectHeaderInlinedTypeHandler())",
                                          "!this->IsObjectHeaderInlinedTypeHandler()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            pAVar8 = GetObjectArrayOrFlagsAsArray(from);
            pAVar8 = Js::JavascriptArray::DeepCopyInstance(pAVar8);
            SetObjectArray(this,pAVar8);
          }
          bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectCopyPhase);
          if (bVar2) {
            Output::Print(L"ObjectCopy succeeded\n");
          }
          this_local._7_1_ = true;
        }
        else {
          bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectCopyPhase);
          if (bVar2) {
            Output::Print(L"ObjectCopy: Can\'t copy: failed to share type\n");
          }
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicObject::TryCopy(DynamicObject* from)
    {
#if ENABLE_TTD
        if (from->GetScriptContext()->ShouldPerformRecordOrReplayAction())
        {
            return false;
        }
#endif

        if (PHASE_OFF1(ObjectCopyPhase))
        {
            return false;
        }
        // Validate that objects are compatible
        if (!this->IsCompatibleForCopy(from))
        {
            return false;
        }
        // Share the type
        // Note: this will mark type as shared in case of success
        if (!from->GetDynamicType()->ShareType())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: failed to share type\n"));
            }
            return false;
        }

        // Update this object
        this->ReplaceType(from->GetDynamicType());
        this->InitSlots(this);
        const int slotCapacity = this->GetTypeHandler()->GetSlotCapacity();
        const uint16 inlineSlotCapacity = this->GetTypeHandler()->GetInlineSlotCapacity();
        const int auxSlotCapacity = slotCapacity - inlineSlotCapacity;

        if (auxSlotCapacity > 0)
        {
            CopyArray(this->auxSlots, auxSlotCapacity, from->auxSlots, auxSlotCapacity);
        }
        if (inlineSlotCapacity != 0)
        {
            Field(Var)* thisInlineSlots = this->GetInlineSlots();
            Field(Var)* fromInlineSlots = from->GetInlineSlots();

            CopyArray(thisInlineSlots, inlineSlotCapacity, fromInlineSlots, inlineSlotCapacity);
        }
        if (from->HasObjectArray())
        {
            Assert(!this->HasObjectArray());
            Assert(!this->IsObjectHeaderInlinedTypeHandler());
            this->SetObjectArray(JavascriptArray::DeepCopyInstance(from->GetObjectArrayOrFlagsAsArray()));
        }
        if (PHASE_TRACE1(ObjectCopyPhase))
        {
            Output::Print(_u("ObjectCopy succeeded\n"));
        }

        return true;
    }